

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O3

bool __thiscall pbrt::GeometricPrimitive::IntersectP(GeometricPrimitive *this,Ray *r,Float tMax)

{
  ulong uVar1;
  ushort uVar2;
  bool bVar3;
  DispatchSplit<6> local_129;
  Float local_128;
  Float local_124;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_120;
  undefined1 local_20;
  
  uVar1 = (this->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  local_124 = tMax;
  if ((((MixMaterial *)(uVar1 & 0xffffffffffff) == (MixMaterial *)0x0) ||
      ((uint)(uVar1 >> 0x31) < 3)) ||
     (uVar2 = (ushort)(uVar1 >> 0x30), (uVar2 & 0xfffffffe) == 8 || uVar2 - 5 < 4)) {
LAB_0046c02e:
    if (((this->alpha).
         super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         .bits & 0xffffffffffff) == 0) {
      local_120.__align =
           (anon_struct_8_0_00000001_for___align)
           (this->shape).
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           .bits;
      local_20 = detail::DispatchSplit<6>::operator()
                           (&local_129,r,&local_124,&local_120,(ulong)local_120.__align >> 0x30);
    }
    else {
      Intersect((optional<pbrt::ShapeIntersection> *)&local_120.__align,this,r,local_124);
    }
  }
  else {
    if (1 < uVar2 - 9) {
      local_128 = tMax;
      bVar3 = MixMaterial::IsTransparent((MixMaterial *)(uVar1 & 0xffffffffffff));
      local_124 = local_128;
      if (!bVar3) goto LAB_0046c02e;
    }
    local_20 = 0;
  }
  return (bool)local_20;
}

Assistant:

bool GeometricPrimitive::IntersectP(const Ray &r, Float tMax) const {
    // Skip shadow intersection test for transparent materials
    if (material && material.IsTransparent())
        return false;

    // Perform shadow intersection with test, handling alpha if necessary
    if (alpha)
        return Intersect(r, tMax).has_value();
    else
        return shape.IntersectP(r, tMax);
}